

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

void aom_highbd_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int nzbins [2];
  int zbins [2];
  int idx_arr [4096];
  
  bVar2 = (byte)log_scale;
  iVar7 = (1 << (bVar2 & 0x1f)) >> 1;
  zbins[0] = *zbin_ptr + iVar7 >> (bVar2 & 0x1f);
  nzbins[0] = -zbins[0];
  zbins[1] = zbin_ptr[1] + iVar7 >> (bVar2 & 0x1f);
  nzbins[1] = -zbins[1];
  lVar14 = 0;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  if (n_coeffs < 1) {
    n_coeffs = lVar14;
  }
  uVar5 = 0;
  for (; n_coeffs != lVar14; lVar14 = lVar14 + 1) {
    sVar1 = scan[lVar14];
    uVar3 = 0x20;
    if (qm_ptr != (qm_val_t *)0x0) {
      uVar3 = (uint)qm_ptr[sVar1];
    }
    if ((zbins[sVar1 != 0] * 0x20 <= (int)(uVar3 * coeff_ptr[sVar1])) ||
       ((int)(uVar3 * coeff_ptr[sVar1]) <= nzbins[sVar1 != 0] * 0x20)) {
      lVar4 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      idx_arr[lVar4] = (int)lVar14;
    }
  }
  uVar8 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  iVar9 = -1;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    iVar13 = idx_arr[uVar8];
    sVar1 = scan[iVar13];
    uVar11 = 0x20;
    if (qm_ptr != (qm_val_t *)0x0) {
      uVar11 = (ulong)qm_ptr[sVar1];
    }
    uVar5 = 0x20;
    if (iqm_ptr != (qm_val_t *)0x0) {
      uVar5 = (uint)iqm_ptr[sVar1];
    }
    uVar3 = coeff_ptr[sVar1] >> 0x1f;
    uVar12 = (ulong)((uint)(sVar1 != 0) * 2);
    lVar14 = uVar11 * (long)(int)((*(short *)((long)round_ptr + uVar12) + iVar7 >> (bVar2 & 0x1f)) +
                                 ((coeff_ptr[sVar1] ^ uVar3) - uVar3));
    uVar10 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar12) *
                    ((*(short *)((long)quant_ptr + uVar12) * lVar14 >> 0x10) + lVar14) >>
                   (0x15 - bVar2 & 0x3f));
    qcoeff_ptr[sVar1] = (uVar3 ^ uVar10) - uVar3;
    dqcoeff_ptr[sVar1] =
         ((int)(((int)((int)*(short *)((long)dequant_ptr + uVar12) * uVar5 + 0x10) >> 5) * uVar10)
          >> (bVar2 & 0x1f) ^ uVar3) - uVar3;
    if (uVar10 == 0) {
      iVar13 = iVar9;
    }
    iVar9 = iVar13;
  }
  *eob_ptr = (short)iVar9 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  int i, eob = -1;
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int dequant;
  int idx_arr[4096];
  (void)iscan;
  int idx = 0;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    // If the coefficient is out of the base ZBIN range, keep it for
    // quantization.
    if (coeff >= (zbins[rc != 0] * (1 << AOM_QM_BITS)) ||
        coeff <= (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      idx_arr[idx++] = i;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = scan[idx_arr[i]];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 =
        abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
    const int64_t tmpw = tmp1 * wt;
    const int64_t tmp2 = ((tmpw * quant_ptr[rc != 0]) >> 16) + tmpw;
    const int abs_qcoeff = (int)((tmp2 * quant_shift_ptr[rc != 0]) >>
                                 (16 - log_scale + AOM_QM_BITS));
    qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
    dequant =
        (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >> AOM_QM_BITS;
    const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
    dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
    if (abs_qcoeff) eob = idx_arr[i];
  }
  *eob_ptr = eob + 1;
}